

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void __thiscall
TPZFMatrix<long_double>::CopyFrom(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *mat)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 local_48 [24];
  
  lVar1 = (mat->super_TPZBaseMatrix).fRow;
  lVar2 = (mat->super_TPZBaseMatrix).fCol;
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (this,lVar1,lVar2);
  if (0 < lVar1) {
    lVar3 = 0;
    do {
      if (0 < lVar2) {
        lVar4 = 0;
        do {
          (*(mat->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(mat,lVar3,lVar4);
          (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(this,lVar3,lVar4,local_48);
          lVar4 = lVar4 + 1;
        } while (lVar2 != lVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != lVar1);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::CopyFrom(const TPZMatrix<TVar> *mat)
{
    const auto r = mat->Rows();
    const auto c = mat->Cols();
    this->Resize(r,c);
    for(auto i = 0 ;i < r;i++){
        for(auto j = 0; j < c; j++){
            this->PutVal(i,j,mat->GetVal(i,j));
        }
    }
}